

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCollapsingSortedStoragesList.hpp
# Opt level: O1

void __thiscall
supermap::
BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
::append(BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
         *this,unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
               *storage)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  tuple<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  tVar2;
  unsigned_long batchSize;
  long *plVar3;
  element_type *peVar4;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode>
  *psVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  long lVar9;
  ulong uVar10;
  ListNode *__tmp;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  initializer_list<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>
  __l;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode>
  nextNode;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode>
  curNode;
  SortedStorage mergedKeys;
  allocator_type local_181;
  element_type *local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  element_type *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
  *local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_158;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode>
  *local_150;
  shared_ptr<supermap::io::FileManager> local_148;
  string local_138;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
  local_118;
  undefined **local_e0;
  undefined **local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  long local_b8;
  undefined *local_b0;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>_()>
  *local_a8;
  _Any_data local_a0;
  code *local_90;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
  local_80;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  local_48;
  
  local_150 = &this->head_;
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00127548;
  local_158 = &(this->head_).
               super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
  peVar4 = (this->head_).
           super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var1 = (this->head_).
           super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->head_).
  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->head_).
  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar6 = *(undefined4 *)&this->batchSize_;
  uVar7 = *(undefined4 *)((long)&this->batchSize_ + 4);
  p_Var8[1]._vptr__Sp_counted_base =
       (_func_int **)
       (storage->_M_t).
       super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
       .
       super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
       ._M_head_impl;
  (storage->_M_t).
  super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  .
  super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
  ._M_head_impl =
       (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
        *)0x0;
  *(element_type **)&p_Var8[1]._M_use_count = peVar4;
  p_Var8[2]._vptr__Sp_counted_base = (_func_int **)p_Var1;
  p_Var8[2]._M_use_count = uVar6;
  p_Var8[2]._M_weak_count = uVar7;
  (this->head_).
  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var8 + 1);
  p_Var1 = (this->head_).
           super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->head_).
  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var8;
  local_160 = this;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  local_170 = (local_150->
              super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
  local_168._M_pi = local_158->_M_pi;
  if (local_168._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_168._M_pi)->_M_use_count = (local_168._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_168._M_pi)->_M_use_count = (local_168._M_pi)->_M_use_count + 1;
    }
  }
  local_180 = (local_170->next).
              super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_178._M_pi =
       (local_170->next).
       super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_178._M_pi)->_M_use_count = (local_178._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_178._M_pi)->_M_use_count = (local_178._M_pi)->_M_use_count + 1;
    }
  }
  if (local_180 != (element_type *)0x0) {
    local_a8 = &local_160->innerRegisterSupplier_;
    do {
      peVar4 = local_170;
      lVar9 = (**(code **)(*(long *)(local_170->storage)._M_t.
                                    super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                          + 8))();
      uVar10 = ((lVar9 + peVar4->rankOneSize_) - 1) / peVar4->rankOneSize_;
      auVar13._8_4_ = (int)(uVar10 >> 0x20);
      auVar13._0_8_ = uVar10;
      auVar13._12_4_ = 0x45300000;
      dVar11 = log2((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0));
      peVar4 = local_180;
      lVar9 = (**(code **)(*(long *)(local_180->storage)._M_t.
                                    super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                          + 8))();
      uVar10 = ((lVar9 + peVar4->rankOneSize_) - 1) / peVar4->rankOneSize_;
      auVar14._8_4_ = (int)(uVar10 >> 0x20);
      auVar14._0_8_ = uVar10;
      auVar14._12_4_ = 0x45300000;
      dVar12 = log2((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0));
      if ((ulong)((long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11) <
          (ulong)((long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12))
      break;
      tVar2.
      super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
      .
      super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
      ._M_head_impl =
           (local_180->storage)._M_t.
           super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
      ;
      local_118.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      ._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00126f80;
      local_118.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .register_.
      super_StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
      .
      super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
      ._vptr_Cloneable =
           (Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
            )&PTR_clone_00126fb0;
      local_118.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .register_.count_ =
           *(unsigned_long *)
            ((long)tVar2.
                   super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                   .
                   super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                   ._M_head_impl + 0x10);
      (**(code **)**(undefined8 **)
                    ((long)tVar2.
                           super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                           .
                           super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                           ._M_head_impl + 0x18))
                (&local_118.
                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                  .
                  super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                  .
                  super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                  .register_.innerRegister_);
      local_118.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)
                ((long)tVar2.
                       super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                       .
                       super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                       ._M_head_impl + 0x20);
      local_118.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)tVar2.
                   super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                   .
                   super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                   ._M_head_impl + 0x28);
      if (local_118.
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_118.
           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
           .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_118.
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                .storageFile_.
                super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_118.
           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
           .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_118.
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                .storageFile_.
                super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_118.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      ._vptr_OrderedStorage = (_func_int **)&PTR_append_00126ea8;
      local_118.
      super_Findable<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::Key<30UL>_>.
      _vptr_Findable = (_func_int **)&DAT_00126ef0;
      tVar2.
      super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
      .
      super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
      ._M_head_impl =
           (local_170->storage)._M_t.
           super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
      ;
      local_e0 = &PTR___cxa_pure_virtual_00126f80;
      local_d8 = &PTR_clone_00126fb0;
      local_d0 = *(undefined8 *)
                  ((long)tVar2.
                         super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                         .
                         super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                         ._M_head_impl + 0x10);
      (**(code **)**(undefined8 **)
                    ((long)tVar2.
                           super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                           .
                           super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                           ._M_head_impl + 0x18))(local_c8);
      local_c0 = *(undefined8 *)
                  ((long)tVar2.
                         super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                         .
                         super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                         ._M_head_impl + 0x20);
      local_b8 = *(long *)((long)tVar2.
                                 super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                                 .
                                 super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                                 ._M_head_impl + 0x28);
      if (local_b8 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_b8 + 8) = *(int *)(local_b8 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_b8 + 8) = *(int *)(local_b8 + 8) + 1;
        }
      }
      local_e0 = &PTR_append_00126ea8;
      local_b0 = &DAT_00126ef0;
      __l._M_len = 2;
      __l._M_array = &local_118;
      std::
      vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
      ::vector(&local_48,__l,&local_181);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"collapse","");
      lVar9 = *(long *)((long)(local_170->storage)._M_t.
                              super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                       + 0x20);
      local_148.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(lVar9 + 0x20);
      local_148.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0x28);
      if (local_148.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_148.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_148.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_148.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_148.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      batchSize = local_160->batchSize_;
      std::
      function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>_()>
      ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>_()>
                  *)&local_a0,local_a8);
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
      ::SortedSingleFileIndexedStorage
                (&local_80,&local_48,&local_138,&local_148,batchSize,
                 (InnerRegisterSupplier *)&local_a0);
      if (local_90 != (code *)0x0) {
        (*local_90)(&local_a0,&local_a0,__destroy_functor);
      }
      if (local_148.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.
                   super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
      ::~vector(&local_48);
      lVar9 = 0x38;
      do {
        *(undefined ***)
         ((long)&local_118.
                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 ._vptr_OrderedStorage + lVar9) = &PTR_append_00126f08;
        p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_118.
                          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                          .storageFile_.
                          super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + lVar9);
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        *(undefined ***)
         ((long)&local_118.
                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 ._vptr_OrderedStorage + lVar9) = &PTR___cxa_pure_virtual_00126f80;
        *(undefined ***)
         ((long)&local_118.
                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .register_.
                 super_StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
         + lVar9) = &PTR_clone_00126fb0;
        plVar3 = *(long **)((long)&local_118.
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   .
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   .register_.innerRegister_ + lVar9);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x10))();
        }
        *(undefined8 *)
         ((long)&local_118.
                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .register_.innerRegister_ + lVar9) = 0;
        lVar9 = lVar9 + -0x38;
      } while (lVar9 != -0x38);
      tVar2.
      super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
      .
      super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
      ._M_head_impl =
           (local_180->storage)._M_t.
           super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
      ;
      (**(code **)(*(long *)tVar2.
                            super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                            .
                            super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                            ._M_head_impl + 0x28))
                (tVar2.
                 super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                 .
                 super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                 ._M_head_impl,&local_80);
      (local_150->
      super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = local_180;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_158,&local_178);
      local_170 = local_180;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_168,&local_178);
      psVar5 = &local_180->next;
      local_180 = (local_180->next).
                  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_178,
                 &(psVar5->
                  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount);
      local_80.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      ._vptr_OrderedStorage = (_func_int **)&PTR_append_00126f08;
      if (local_80.
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.
                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                   .storageFile_.
                   super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_80.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      ._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00126f80;
      local_80.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .register_.
      super_StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
      .
      super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
      ._vptr_Cloneable =
           (Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
            )&PTR_clone_00126fb0;
      if (local_80.
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          .
          super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          .
          super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          .register_.innerRegister_._M_t.
          super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
          .
          super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
           )0x0) {
        (**(code **)((long)*(Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
                             *)local_80.
                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                               .
                               super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                               .
                               super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                               .register_.innerRegister_._M_t.
                               super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
                               .
                               super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_false>
                               ._M_head_impl + 0x10))();
      }
    } while (local_180 != (element_type *)0x0);
  }
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_168._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168._M_pi);
  }
  return;
}

Assistant:

void append(std::unique_ptr<SortedStorage> &&storage) override {
        head_ = std::make_shared<ListNode>(std::move(storage), std::move(head_), batchSize_);
        std::shared_ptr<ListNode> curNode = head_;
        std::shared_ptr<ListNode> nextNode = curNode->next;
        while (nextNode != nullptr) {
            assert(curNode->getRank() <= nextNode->getRank());
            if (curNode->getRank() < nextNode->getRank()) {
                break;
            }
            assert(curNode->valid());
            assert(nextNode->valid());
            SortedStorage mergedKeys(
                std::vector<SortedStorage>{*nextNode->storage, *curNode->storage},
                "collapse",
                curNode->storage->getFileManager(),
                batchSize_,
                innerRegisterSupplier_
            );
            nextNode->storage->resetWith(std::move(mergedKeys));
            head_ = nextNode;
            curNode = nextNode;
            nextNode = nextNode->next;
        }
    }